

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj4fio.h
# Opt level: O2

ssize_t fiobj_send_free(intptr_t uuid,FIOBJ o)

{
  fio_write_args_s options;
  ssize_t sVar1;
  fio_str_info_s s;
  uint7 uStack_37;
  fio_str_info_s local_30;
  
  fiobj_obj2cstr(&local_30,o);
  options.after.dealloc = fiobj4sock_dealloc;
  options.data.fd = o;
  options.length = local_30.len;
  options.offset = (long)local_30.data - o;
  options._32_8_ = (ulong)uStack_37 << 8;
  sVar1 = fio_write2_fn(uuid,options);
  return sVar1;
}

Assistant:

static inline __attribute__((unused)) ssize_t fiobj_send_free(intptr_t uuid,
                                                              FIOBJ o) {
  fio_str_info_s s = fiobj_obj2cstr(o);
  return fio_write2(uuid, .data.buffer = (void *)(o),
                    .offset = (uintptr_t)(((intptr_t)s.data) - ((intptr_t)(o))),
                    .length = s.len, .after.dealloc = fiobj4sock_dealloc);
}